

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::~InternalMetadataWithArenaBase
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  string *this_00;
  
  if ((((ulong)this->ptr_ & 1) != 0) &&
     (this_00 = (string *)((ulong)this->ptr_ & 0xfffffffffffffffe), *(long *)(this_00 + 0x20) == 0))
  {
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
    operator_delete(this_00,0x28);
  }
  this->ptr_ = (void *)0x0;
  return;
}

Assistant:

~InternalMetadataWithArenaBase() {
    if (have_unknown_fields() && arena() == NULL) {
      delete PtrValue<Container>();
    }
    ptr_ = NULL;
  }